

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O0

int nn_bus_create(void *hint,nn_sockbase **sockbase)

{
  nn_sockbase_vfptr *vfptr;
  nn_bus *in_RSI;
  nn_bus *self;
  
  vfptr = (nn_sockbase_vfptr *)nn_alloc_(0x12b3c8);
  if (vfptr == (nn_sockbase_vfptr *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/bus/bus.c"
            ,0x7d);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_bus_init(in_RSI,vfptr,(void *)0x12b437);
  (in_RSI->xbus).sockbase.vfptr = vfptr;
  return 0;
}

Assistant:

static int nn_bus_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_bus *self;

    self = nn_alloc (sizeof (struct nn_bus), "socket (bus)");
    alloc_assert (self);
    nn_bus_init (self, &nn_bus_sockbase_vfptr, hint);
    *sockbase = &self->xbus.sockbase;

    return 0;
}